

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

void __thiscall
jsonrpccxx::JsonRpcException::JsonRpcException(JsonRpcException *this,int code,string *message)

{
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  *(undefined ***)this = &PTR__JsonRpcException_00193800;
  this->code = code;
  std::__cxx11::string::string((string *)&this->message,(string *)message);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->data,(nullptr_t)0x0);
  std::__cxx11::to_string(&sStack_58,code);
  std::operator+(&local_38,&sStack_58,": ");
  std::operator+(&this->err,&local_38,message);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

JsonRpcException(int code, const std::string &message) noexcept : code(code), message(message), data(nullptr), err(std::to_string(code) + ": " + message) {}